

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureDivision.hpp
# Opt level: O1

StructureDivision *
njoy::ENDFtk::sectionEndRecord(StructureDivision *__return_storage_ptr__,int MAT,int MF)

{
  undefined8 *puVar1;
  char *args;
  
  if (MAT < 1) {
    tools::Log::error<char_const*>("Illegal material number (MAT) specified in SEND record");
    tools::Log::info<char_const*>("SEND records require a material number greater than 0");
    args = "Specified material number: {}";
    MF = MAT;
  }
  else {
    if (0 < MF) {
      (__return_storage_ptr__->base).fields.
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = 0.0;
      (__return_storage_ptr__->base).fields.
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
      (__return_storage_ptr__->base).fields.
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl = 0;
      (__return_storage_ptr__->base).fields.
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = 0;
      (__return_storage_ptr__->base).fields.
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long> = 0;
      ((_Head_base<4UL,_long,_false> *)
      ((long)&(__return_storage_ptr__->base).fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> + 8))->
      _M_head_impl = 0;
      (__return_storage_ptr__->tail).fields._M_elems[0] = MAT;
      (__return_storage_ptr__->tail).fields._M_elems[1] = MF;
      (__return_storage_ptr__->tail).fields._M_elems[2] = 0;
      return __return_storage_ptr__;
    }
    tools::Log::error<char_const*>("Illegal file number (MF) specified in SEND record");
    tools::Log::info<char_const*>("SEND records require a file number greater than 0");
    args = "Specified file number: {}";
  }
  tools::Log::info<char_const*,int>(args,MF);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

inline StructureDivision sectionEndRecord( int MAT, int MF ) {

    if ( MAT < 1 ) {

      Log::error( "Illegal material number (MAT) specified in SEND record" );
      Log::info( "SEND records require a material number greater than 0" );
      Log::info( "Specified material number: {}", MAT );
      throw std::exception();
    }
    if ( MF < 1 ) {

      Log::error( "Illegal file number (MF) specified in SEND record" );
      Log::info( "SEND records require a file number greater than 0" );
      Log::info( "Specified file number: {}", MF );
      throw std::exception();
    }
    return StructureDivision( 0.0, 0.0, 0, 0, 0, 0, MAT, MF, 0 );
  }